

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<float>::SolveBICGStab
          (TPZMatrix<float> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<float> *F,TPZFMatrix<float> *result,TPZFMatrix<float> *residual,REAL *tol,
          int FromCurrent)

{
  long lVar1;
  undefined8 in_RDX;
  TPZMatrixSolver<float> *precond;
  double *in_stack_00000e90;
  int64_t *in_stack_00000e98;
  TPZMatrixSolver<float> *in_stack_00000ea0;
  TPZFMatrix<float> *in_stack_00000ea8;
  TPZFMatrix<float> *in_stack_00000eb0;
  TPZMatrix<float> *in_stack_00000eb8;
  TPZFMatrix<float> *in_stack_00000ed0;
  int in_stack_00000ed8;
  
  lVar1 = __dynamic_cast(in_RDX,&TPZSolver::typeinfo,&TPZMatrixSolver<float>::typeinfo,0);
  if (lVar1 == 0) {
    __cxa_bad_cast();
  }
  BiCGSTAB<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
            (in_stack_00000eb8,in_stack_00000eb0,in_stack_00000ea8,in_stack_00000ea0,
             in_stack_00000e98,in_stack_00000e90,in_stack_00000ed0,in_stack_00000ed8);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveBICGStab(int64_t &numiterations, TPZSolver &preconditioner,
							  const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
							  TPZFMatrix<TVar> *residual, REAL &tol,const int FromCurrent)  {
    if constexpr(std::is_floating_point<TVar>::value){
        TPZMatrixSolver<TVar> &precond = dynamic_cast<TPZMatrixSolver<TVar> &>(preconditioner);
        BiCGSTAB(*this,result,F,precond,numiterations,tol,residual,FromCurrent);
    }else{
        PZError<<__PRETTY_FUNCTION__<<" is currently not implemented ";
        PZError<<"for this type\nAborting...";
        DebugStop();
    }    
}